

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

Value __thiscall
MiniScript::Parser::ParseUnaryMinus(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  int iVar1;
  ParseState *this_00;
  undefined4 uVar2;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar3;
  Value VVar4;
  Lexer local_118;
  Lexer local_110;
  Lexer local_108;
  Value local_100;
  Value local_f0;
  Value val;
  Value local_c0;
  Token local_b0;
  TACLine local_90;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  Lexer::Peek((Token *)&val,this_01);
  uVar2 = val._0_4_;
  String::~String((String *)&val.data);
  if (uVar2 == 7) {
    Lexer::Dequeue(&local_b0,this_01);
    String::~String(&local_b0.text);
    local_110.ls = this_01->ls;
    if (local_110.ls != (LexerStorage *)0x0) {
      (local_110.ls)->refCount = (local_110.ls)->refCount + 1;
    }
    AllowLineBreak(&local_110);
    Lexer::release(&local_110);
    local_118.ls = this_01->ls;
    if (local_118.ls != (LexerStorage *)0x0) {
      (local_118.ls)->refCount = (local_118.ls)->refCount + 1;
    }
    ParseNew((Parser *)&val,tokens,SUB81(&local_118,0),false);
    Lexer::release(&local_118);
    if (val.type == Number) {
      val.data.number = val.data.number ^ 0x8000000000000000;
      Value::Value((Value *)this,&val);
    }
    else {
      this_00 = (ParseState *)tokens[6].ls;
      iVar1 = this_00->nextTempNum;
      this_00->nextTempNum = iVar1 + 1;
      local_f0.type = Temp;
      local_f0.noInvoke = false;
      local_f0.localOnly = Off;
      local_f0.data.tempNum = iVar1;
      Value::Value(&local_c0,(Value *)Value::zero);
      local_100.type = val.type;
      local_100.noInvoke = val.noInvoke;
      local_100.localOnly = val.localOnly;
      local_100.data = val.data;
      if (val.data.ref != (RefCountedStorage *)0x0 && Temp < val.type) {
        (val.data.ref)->refCount = (val.data.ref)->refCount + 1;
      }
      TACLine::TACLine(&local_90,&local_f0,AMinusB,&local_c0,&local_100);
      ParseState::Add(this_00,&local_90);
      TACLine::~TACLine(&local_90);
      Value::~Value(&local_100);
      Value::~Value(&local_c0);
      Value::~Value(&local_f0);
      *(undefined2 *)&(this->errorContext).ss = 2;
      *(undefined1 *)((long)&(this->errorContext).ss + 2) = 0;
      *(int *)&(this->errorContext).isTemp = iVar1;
    }
    Value::~Value(&val);
    aVar3 = extraout_RDX_00;
  }
  else {
    local_108.ls = this_01->ls;
    if (local_108.ls != (LexerStorage *)0x0) {
      (local_108.ls)->refCount = (local_108.ls)->refCount + 1;
    }
    ParseNew(this,tokens,SUB81(&local_108,0),statementStart);
    Lexer::release(&local_108);
    aVar3 = extraout_RDX;
  }
  VVar4.data.number = aVar3.number;
  VVar4._0_8_ = this;
  return VVar4;
}

Assistant:

Value Parser::ParseUnaryMinus(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseNew;
		if (tokens.Peek().type != Token::Type::OpMinus) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();		// skip '-'

		AllowLineBreak(tokens); // allow a line break after a unary operator
		
		Value val = (*this.*nextLevel)(tokens, false, false);
		if (val.type == ValueType::Number) {
			// If what follows is a numeric literal, just invert it and be done!
			val.data.number = -val.data.number;
			return val;
		}
		// Otherwise, subtract it from 0 and return a new temporary.
		int tempNum = output->nextTempNum++;
		output->Add(TACLine(Value::Temp(tempNum), TACLine::Op::AMinusB, Value::zero, val));
		return Value::Temp(tempNum);
	}